

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

float __thiscall
nv::FloatImage::applyKernelVertical(FloatImage *this,Kernel1 *k,int x,int y,uint c,WrapMode wm)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  
  uVar3 = k->m_windowSize;
  if ((ulong)uVar3 == 0) {
    fVar14 = 0.0;
  }
  else {
    uVar1 = this->m_width;
    uVar2 = this->m_height;
    uVar8 = uVar2 - 1;
    iVar6 = uVar1 - 1;
    iVar10 = 0;
    if (0 < x) {
      iVar10 = x;
    }
    if (iVar6 < iVar10) {
      iVar10 = iVar6;
    }
    uVar4 = x;
    if (uVar1 == 1) {
      uVar4 = 0;
    }
    uVar12 = -uVar4;
    if (0 < (int)uVar4) {
      uVar12 = uVar4;
    }
    fVar14 = 0.0;
    uVar11 = 0;
    do {
      uVar4 = (y - (uVar3 >> 1)) + 1 + (int)uVar11;
      uVar13 = (uint)uVar1;
      if (wm == WrapMode_Repeat) {
        if ((int)uVar4 < 0) {
          uVar9 = (int)(uVar4 + 1) % (int)(uint)uVar2 + uVar8;
        }
        else {
          uVar9 = uVar4 % (uint)uVar2;
        }
        if (x < 0) {
          uVar7 = (x + 1) % (int)uVar13 + iVar6;
        }
        else {
          uVar7 = (uint)x % uVar13;
        }
LAB_001c7fd1:
        iVar5 = uVar9 * uVar1 + uVar7;
      }
      else {
        uVar7 = uVar12;
        if (wm != WrapMode_Clamp) {
          while (uVar13 <= uVar7) {
            uVar9 = ((uVar1 - 2) + (uint)uVar1) - uVar7;
            uVar7 = -uVar9;
            if (0 < (int)uVar9) {
              uVar7 = uVar9;
            }
          }
          if (uVar2 == 1) {
            uVar4 = 0;
          }
          while( true ) {
            uVar9 = -uVar4;
            if (0 < (int)uVar4) {
              uVar9 = uVar4;
            }
            if (uVar9 < uVar2) break;
            uVar4 = ((uint)uVar2 * 2 + -2) - uVar9;
          }
          goto LAB_001c7fd1;
        }
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        if ((int)uVar8 < (int)uVar4) {
          uVar4 = uVar8;
        }
        iVar5 = uVar4 * uVar1 + iVar10;
      }
      fVar14 = fVar14 + k->m_data[uVar11] *
                        this->m_mem[(ulong)(c * uVar1 * (uint)uVar2) + (long)iVar5];
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar3);
  }
  return fVar14;
}

Assistant:

float FloatImage::applyKernelVertical(const Kernel1 * k, int x, int y, uint c, WrapMode wm) const
{
	nvDebugCheck(k != NULL);
	
	const uint kernelWindow = k->windowSize();
	const int kernelOffset = int(kernelWindow / 2) - 1;
	
	const float * channel = this->channel(c);

	float sum = 0.0f;
	for (uint i = 0; i < kernelWindow; i++)
	{
		const int src_y = int(y + i) - kernelOffset;
		const int idx = this->index(x, src_y, wm);
		
		sum += k->valueAt(i) * channel[idx];
	}
	
	return sum;
}